

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O1

int jx9_hashmap_sort(jx9_context *pCtx,int nArg,jx9_value **apArg)

{
  int iVar1;
  jx9_value *pjVar2;
  jx9_hashmap *pMap;
  void *pCmpData;
  jx9_real jVar3;
  
  if ((nArg < 1) || (((*apArg)->iFlags & 0x40) == 0)) {
    jVar3 = 0.0;
  }
  else {
    pMap = (jx9_hashmap *)((*apArg)->x).pOther;
    jVar3 = 4.94065645841247e-324;
    if (1 < pMap->nEntry) {
      if (nArg == 1) {
        pCmpData = (void *)0x0;
      }
      else {
        pjVar2 = apArg[1];
        jx9MemObjToInteger(pjVar2);
        iVar1 = *(int *)&pjVar2->x;
        pCmpData = (void *)0x0;
        if (iVar1 != 3) {
          pCmpData = (void *)(long)iVar1;
        }
      }
      HashmapMergeSort(pMap,HashmapCmpCallback1,pCmpData);
      HashmapSortRehash(pMap);
    }
  }
  pjVar2 = pCtx->pRet;
  jx9MemObjRelease(pjVar2);
  (pjVar2->x).rVal = jVar3;
  pjVar2->iFlags = pjVar2->iFlags & 0xfffffe90U | 8;
  return 0;
}

Assistant:

static int jx9_hashmap_sort(jx9_context *pCtx, int nArg, jx9_value **apArg)
{
	jx9_hashmap *pMap;
	/* Make sure we are dealing with a valid hashmap */
	if( nArg < 1 || !jx9_value_is_json_array(apArg[0]) ){
		/* Missing/Invalid arguments, return FALSE */
		jx9_result_bool(pCtx, 0);
		return JX9_OK;
	}
	/* Point to the internal representation of the input hashmap */
	pMap = (jx9_hashmap *)apArg[0]->x.pOther;
	if( pMap->nEntry > 1 ){
		sxi32 iCmpFlags = 0;
		if( nArg > 1 ){
			/* Extract comparison flags */
			iCmpFlags = jx9_value_to_int(apArg[1]);
			if( iCmpFlags == 3 /* SORT_REGULAR */ ){
				iCmpFlags = 0; /* Standard comparison */
			}
		}
		/* Do the merge sort */
		HashmapMergeSort(pMap, HashmapCmpCallback1, SX_INT_TO_PTR(iCmpFlags));
		/* Rehash [Do not maintain index association as requested by the JX9 specification] */
		HashmapSortRehash(pMap);
	}
	/* All done, return TRUE */
	jx9_result_bool(pCtx, 1);
	return JX9_OK;
}